

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::~Federate(Federate *this)

{
  this->_vptr_Federate = (_func_int **)&PTR__Federate_00445998;
  if ((this->currentMode)._M_i != FINALIZE) {
    finalize(this);
  }
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->errorHandlerCallback);
  CLI::std::_Function_base::~_Function_base
            ((_Function_base *)&this->cosimulationTerminationCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->executingEntryCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->initializingEntryCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->timeRequestReturnCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->modeUpdateCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->timeUpdateCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->timeRequestEntryCallback);
  std::__cxx11::string::~string((string *)&this->mName);
  std::
  unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  ::~unique_ptr(&this->potManager);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::~unique_ptr(&this->cManager);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::~unique_ptr(&this->asyncCallInfo);
  std::__cxx11::string::~string((string *)&this->configFile);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Federate::~Federate()
{
    if (currentMode != Modes::FINALIZE) {
        try {
            finalize();
        }
        // LCOV_EXCL_START
        catch (...)  // do not allow a throw inside the destructor
        {
            // finalize may throw but we can't allow that
            ;
        }
        // LCOV_EXCL_STOP
    }
}